

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O1

int Llb_ManReachMinCut(Aig_Man_t *pAig,Gia_ParLlb_t *pPars)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *p;
  Vec_Ptr_t *vResult;
  long lVar4;
  long lVar5;
  int level;
  timespec ts;
  timespec local_40;
  
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  iVar2 = pPars->TimeLimit;
  if ((long)iVar2 == 0) {
    lVar5 = 0;
  }
  else {
    iVar3 = clock_gettime(3,&local_40);
    if (iVar3 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    lVar5 = lVar5 + (long)iVar2 * 1000000;
  }
  pPars->TimeTarget = lVar5;
  p = Aig_ManDupFlopsOnly(pAig);
  if (pPars->fVerbose != 0) {
    Aig_ManPrintStats(pAig);
  }
  if (pPars->fVerbose != 0) {
    Aig_ManPrintStats(p);
  }
  Aig_ManFanoutStart(p);
  vResult = Llb_ManComputeCuts(p,pPars->nPartValue,pPars->fVerbose,pPars->fVeryVerbose);
  if (pPars->TimeLimit != 0) {
    iVar2 = clock_gettime(3,&local_40);
    if (iVar2 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    if (pPars->TimeTarget < lVar5) {
      if (pPars->fSilent == 0) {
        printf("Reached timeout (%d seconds) after partitioning.\n",(ulong)(uint)pPars->TimeLimit);
      }
      if (0 < vResult->nSize) {
        lVar4 = 0;
        do {
          pvVar1 = vResult->pArray[lVar4];
          if (pvVar1 != (void *)0x0) {
            if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar1 + 8));
              *(undefined8 *)((long)pvVar1 + 8) = 0;
            }
            free(pvVar1);
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < vResult->nSize);
      }
      if (vResult->pArray != (void **)0x0) {
        free(vResult->pArray);
        vResult->pArray = (void **)0x0;
      }
      if (vResult != (Vec_Ptr_t *)0x0) {
        free(vResult);
      }
      Aig_ManFanoutStop(p);
      Aig_ManCleanMarkAB(p);
      Aig_ManStop(p);
      return -1;
    }
  }
  iVar2 = -1;
  if (pPars->fSkipReach == 0) {
    iVar2 = Llb_CoreExperiment(pAig,p,pPars,vResult,pPars->TimeTarget);
  }
  if (0 < vResult->nSize) {
    lVar5 = 0;
    do {
      pvVar1 = vResult->pArray[lVar5];
      if (pvVar1 != (void *)0x0) {
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
          *(undefined8 *)((long)pvVar1 + 8) = 0;
        }
        free(pvVar1);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < vResult->nSize);
  }
  if (vResult->pArray != (void **)0x0) {
    free(vResult->pArray);
    vResult->pArray = (void **)0x0;
  }
  if (vResult != (Vec_Ptr_t *)0x0) {
    free(vResult);
  }
  Aig_ManFanoutStop(p);
  Aig_ManCleanMarkAB(p);
  Aig_ManStop(p);
  if (iVar2 == -1) {
    level = 3;
    iVar3 = clock_gettime(3,&local_40);
    if (iVar3 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    Abc_Print(level,"%s =","Total runtime of the min-cut-based reachability engine");
    Abc_Print(level,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
  }
  return iVar2;
}

Assistant:

int Llb_ManReachMinCut( Aig_Man_t * pAig, Gia_ParLlb_t * pPars )
{
    extern Vec_Ptr_t * Llb_ManComputeCuts( Aig_Man_t * p, int Num, int fVerbose, int fVeryVerbose );
    Vec_Ptr_t * vResult;
    Aig_Man_t * p;
    int RetValue = -1;
    abctime clk = Abc_Clock();

    // compute time to stop
    pPars->TimeTarget = pPars->TimeLimit ? pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;

    p = Aig_ManDupFlopsOnly( pAig );
//Aig_ManShow( p, 0, NULL );
    if ( pPars->fVerbose )
    Aig_ManPrintStats( pAig );
    if ( pPars->fVerbose )
    Aig_ManPrintStats( p );
    Aig_ManFanoutStart( p );

    vResult = Llb_ManComputeCuts( p, pPars->nPartValue, pPars->fVerbose, pPars->fVeryVerbose );

    if ( pPars->TimeLimit && Abc_Clock() > pPars->TimeTarget )
    {
        if ( !pPars->fSilent )
            printf( "Reached timeout (%d seconds) after partitioning.\n", pPars->TimeLimit );

        Vec_VecFree( (Vec_Vec_t *)vResult );
        Aig_ManFanoutStop( p );
        Aig_ManCleanMarkAB( p );
        Aig_ManStop( p );
        return RetValue;
    }

    if ( !pPars->fSkipReach )
        RetValue = Llb_CoreExperiment( pAig, p, pPars, vResult, pPars->TimeTarget );

    Vec_VecFree( (Vec_Vec_t *)vResult );
    Aig_ManFanoutStop( p );
    Aig_ManCleanMarkAB( p );
    Aig_ManStop( p );

    if ( RetValue == -1 )
        Abc_PrintTime( 1, "Total runtime of the min-cut-based reachability engine", Abc_Clock() - clk );
    return RetValue;
}